

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall
ddd::DaTrie<false,_false,_false>::append_edge_(DaTrie<false,_false,_false> *this,Query *query)

{
  byte bVar1;
  uint32_t uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  reference pvVar6;
  DaTrie<false,_false,_false> *in_RSI;
  vector<ddd::Bc,_std::allocator<ddd::Bc>_> *in_RDI;
  uint32_t child_pos;
  uint32_t base;
  uint32_t in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  DaTrie<false,_false,_false> *in_stack_ffffffffffffffe0;
  
  Query::label((Query *)in_RSI);
  uVar2 = xcheck_(in_stack_ffffffffffffffe0,(uint8_t)((ulong)in_RDI >> 0x38),
                  (vector<ddd::Block,_std::allocator<ddd::Block>_> *)
                  CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  uVar5 = uVar2;
  bVar1 = Query::label((Query *)in_RSI);
  uVar3 = uVar2 ^ bVar1;
  fix_(in_RSI,uVar5,(vector<ddd::Block,_std::allocator<ddd::Block>_> *)in_stack_ffffffffffffffe0);
  uVar4 = Query::node_pos((Query *)in_RSI);
  pvVar6 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)uVar4);
  Bc::set_base(pvVar6,uVar5);
  pvVar6 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)uVar3);
  uVar5 = Query::node_pos((Query *)in_RSI);
  Bc::set_check(pvVar6,uVar5);
  Query::next((Query *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc);
  return;
}

Assistant:

void append_edge_(Query& query) {
    assert(query.node_pos() < bc_.size());
    assert(bc_[query.node_pos()].is_fixed());

    auto base = xcheck_(query.label(), blocks_);
    auto child_pos = base ^query.label();

    fix_(child_pos, blocks_);
    bc_[query.node_pos()].set_base(base);
    bc_[child_pos].set_check(query.node_pos());

    if (WithNLM) {
      node_links_[query.node_pos()].child = query.label();
      node_links_[child_pos].sib = query.label();
    }
    query.next(child_pos);
  }